

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

long * __thiscall
google::protobuf::RepeatedField<long>::Mutable(RepeatedField<long> *this,int index)

{
  long *plVar1;
  int in_ESI;
  RepeatedField<long> *in_stack_ffffffffffffffa0;
  
  plVar1 = elements(in_stack_ffffffffffffffa0);
  return plVar1 + in_ESI;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return &elements()[index];
}